

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

bool __thiscall
TPZMatrix<Fad<float>_>::SolveEigenvaluesJacobi
          (TPZMatrix<Fad<float>_> *this,int64_t *numiterations,REAL *tol,TPZVec<Fad<float>_> *Sort)

{
  double dVar1;
  Fad<float> *pFVar2;
  undefined8 uVar3;
  uint uVar4;
  TPZVec<Fad<float>_> *pTVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  EVP_PKEY_CTX *pEVar8;
  _Rb_tree_node_base **pp_Var9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  float *pfVar10;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  _Base_ptr p_Var11;
  _Self __tmp;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  float fVar18;
  Fad<float> exps;
  multiset<double,_std::less<double>,_std::allocator<double>_> myset;
  Fad<float> sint;
  Fad<float> cost;
  Fad<float> maxval;
  Fad<float> Spq;
  Fad<float> aux2;
  Fad<float> aux;
  Fad<float> res;
  Fad<float> Sqq;
  Fad<float> Spp;
  Fad<float> theta;
  undefined1 local_2a0 [16];
  MEM_CPY<float> *local_290;
  float local_288;
  undefined1 local_280 [8];
  undefined1 local_278 [8];
  _Base_ptr local_270;
  _Base_ptr local_268;
  _Rb_tree_node_base *local_260;
  size_t local_258;
  undefined1 local_250 [16];
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> local_240;
  Fad<float> local_230;
  undefined1 local_210 [16];
  undefined1 *local_200;
  undefined1 local_1f8 [16];
  Fad<float> local_1e8;
  long local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [16];
  Fad<float> *local_1a0;
  float local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  long *local_188;
  Fad<float> local_180;
  TPZVec<Fad<float>_> *local_160;
  double *local_158;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> local_150;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_> local_140;
  Fad<float> local_130;
  Fad<float> local_110;
  Fad<float> local_f0;
  Fad<float> local_d0;
  Fad<float> local_b0;
  Fad<float> local_90;
  Fad<float> local_70;
  Fad<float> local_50;
  undefined4 extraout_var_08;
  
  local_280._0_4_ = 0x40000000;
  local_278 = (undefined1  [8])((ulong)local_278 & 0xffffffff00000000);
  local_270 = (_Base_ptr)0x0;
  local_268 = (_Base_ptr)((ulong)local_268 & 0xffffffff00000000);
  local_b0.val_ = (float)*tol;
  local_2a0._0_4_ = local_b0.val_;
  local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffff00000000;
  local_290 = (MEM_CPY<float> *)0x0;
  local_288 = 0.0;
  local_b0.val_ = local_b0.val_ + local_b0.val_;
  local_b0.dx_.num_elts = 0;
  local_b0.dx_.ptr_to_data = (float *)0x0;
  local_b0.defaultVal = 0.0;
  local_188 = numiterations;
  local_160 = Sort;
  local_158 = tol;
  Fad<float>::~Fad((Fad<float> *)local_2a0);
  Fad<float>::~Fad((Fad<float> *)local_280);
  uVar14 = (this->super_TPZBaseMatrix).fRow;
  Fad<float>::Fad(&local_180);
  Fad<float>::Fad(&local_50);
  Fad<float>::Fad(&local_1e8);
  Fad<float>::Fad(&local_230);
  Fad<float>::Fad(&local_d0);
  Fad<float>::Fad(&local_f0);
  Fad<float>::Fad(&local_70);
  Fad<float>::Fad(&local_90);
  Fad<float>::Fad(&local_110);
  local_1c0 = uVar14;
  if (*local_188 < 1) {
    lVar17 = 0;
  }
  else {
    lVar17 = 0;
    uVar15 = 0xffffffffffffffff;
    uVar12 = 0xffffffffffffffff;
    do {
      local_180.val_ = 0.0;
      if (local_180.dx_.num_elts != 0) {
        local_280 = (undefined1  [8])((ulong)local_280 & 0xffffffff00000000);
        Vector<float>::operator=(&local_180.dx_,(float *)local_280);
      }
      local_1c8 = lVar17;
      if (0 < (long)uVar14) {
        uVar16 = 0;
        do {
          if (uVar16 != 0) {
            uVar13 = 0;
            do {
              if (((this->super_TPZBaseMatrix).fRow <= (long)uVar16) ||
                 ((this->super_TPZBaseMatrix).fCol <= (long)uVar13)) {
                Error("TPZMatrix<TVar>::Operator()","Index out of range");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                           ,0x33d);
              }
              iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                                (this,uVar16,uVar13);
              if (ABS(local_180.val_) < ABS(*(float *)CONCAT44(extraout_var,iVar6))) {
                if (((this->super_TPZBaseMatrix).fRow <= (long)uVar16) ||
                   ((this->super_TPZBaseMatrix).fCol <= (long)uVar13)) {
                  Error("TPZMatrix<TVar>::Operator()","Index out of range");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                             ,0x33d);
                }
                iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                                  (this,uVar16,uVar13);
                local_180.val_ = ABS(*(float *)CONCAT44(extraout_var_00,iVar6));
                uVar12 = uVar16;
                uVar15 = uVar13;
                if (local_180.dx_.num_elts != 0) {
                  local_280 = (undefined1  [8])((ulong)local_280 & 0xffffffff00000000);
                  Vector<float>::operator=(&local_180.dx_,(float *)local_280);
                }
              }
              uVar13 = uVar13 + 1;
            } while (uVar16 != uVar13);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar14);
      }
      local_b0.val_ = local_180.val_;
      Vector<float>::operator=(&local_b0.dx_,&local_180.dx_);
      local_b0.defaultVal = local_180.defaultVal;
      lVar17 = local_1c8;
      if ((double)ABS(local_b0.val_) < *local_158) break;
      local_280._0_4_ = 0.5;
      local_278 = (undefined1  [8])((ulong)local_278 & 0xffffffff00000000);
      local_270 = (_Base_ptr)0x0;
      local_268 = (_Base_ptr)((ulong)local_268 & 0xffffffff00000000);
      local_2a0._0_4_ = 2.0;
      local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffff00000000;
      local_290 = (MEM_CPY<float> *)0x0;
      local_288 = 0.0;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar12) || ((long)(uVar15 | uVar12) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar12,uVar15);
      local_250._8_8_ = CONCAT44(extraout_var_01,iVar6);
      local_250._0_8_ = (Fad<float> *)local_2a0;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar15 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar15,uVar15);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar12) || ((long)uVar12 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar12)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar12,uVar12);
      local_1f8._8_8_ = CONCAT44(extraout_var_03,iVar7);
      local_210._8_8_ = local_250;
      local_200 = local_1f8;
      local_240.fadexpr_.right_ = (Fad<float> *)local_210;
      local_240.fadexpr_.left_ = (Fad<float> *)local_280;
      local_1f8._0_8_ = (Fad<float> *)CONCAT44(extraout_var_02,iVar6);
      Fad<float>::operator=
                (&local_50,
                 (FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadFuncAtan<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>_>_>_>_>_>_>
                  *)&local_240);
      Fad<float>::~Fad((Fad<float> *)local_2a0);
      Fad<float>::~Fad((Fad<float> *)local_280);
      FadFuncCos<Fad<float>_>::FadFuncCos((FadFuncCos<Fad<float>_> *)local_2a0,&local_50);
      FadExpr<FadFuncCos<Fad<float>_>_>::FadExpr
                ((FadExpr<FadFuncCos<Fad<float>_>_> *)local_280,(FadFuncCos<Fad<float>_> *)local_2a0
                );
      Fad<float>::~Fad((Fad<float> *)local_2a0);
      fVar18 = local_270._0_4_;
      uVar14 = (ulong)local_270 & 0xffffffff;
      if (local_270._0_4_ == (float)local_1e8.dx_.num_elts) {
        if (local_270._0_4_ != 0.0) {
LAB_00c84179:
          pfVar10 = local_1e8.dx_.ptr_to_data;
          if (0 < (int)fVar18) {
            uVar16 = 0;
            do {
              local_198 = -(float)(&local_268->_M_color)[uVar16];
              uStack_194 = 0x80000000;
              uStack_190 = 0x80000000;
              uStack_18c = 0x80000000;
              fVar18 = sinf((float)local_278._0_4_);
              *(float *)((long)pfVar10 + uVar16 * 4) = fVar18 * local_198;
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
          }
        }
      }
      else if (local_270._0_4_ == 0.0) {
        if ((float)local_1e8.dx_.num_elts != 0.0) {
          if ((EVP_PKEY_CTX *)local_1e8.dx_.ptr_to_data != (EVP_PKEY_CTX *)0x0) {
            operator_delete__(local_1e8.dx_.ptr_to_data);
          }
          local_1e8.dx_.num_elts = 0;
          local_1e8.dx_.ptr_to_data = (float *)0x0;
        }
      }
      else {
        if ((float)local_1e8.dx_.num_elts != 0.0) {
          if ((EVP_PKEY_CTX *)local_1e8.dx_.ptr_to_data != (EVP_PKEY_CTX *)0x0) {
            operator_delete__(local_1e8.dx_.ptr_to_data);
          }
          local_1e8.dx_.ptr_to_data = (float *)0x0;
        }
        local_1e8.dx_.num_elts = (int)fVar18;
        uVar16 = uVar14 * 4;
        uVar13 = uVar16;
        if ((int)fVar18 < 0) {
          uVar13 = 0xffffffffffffffff;
        }
        pEVar8 = (EVP_PKEY_CTX *)operator_new__(uVar13);
        local_1e8.dx_.ptr_to_data = (float *)pEVar8;
        if (local_270._0_4_ != 0.0) goto LAB_00c84179;
        if (0 < (int)fVar18) {
          lVar17 = 0;
          do {
            pp_Var9 = (_Rb_tree_node_base **)((long)&local_268->_M_color + lVar17);
            if (local_270._0_4_ == 0.0) {
              pp_Var9 = &local_260;
            }
            local_198 = -*(float *)pp_Var9;
            uStack_194 = 0x80000000;
            uStack_190 = 0x80000000;
            uStack_18c = 0x80000000;
            fVar18 = sinf((float)local_278._0_4_);
            *(float *)(pEVar8 + lVar17) = fVar18 * local_198;
            lVar17 = lVar17 + 4;
          } while (uVar16 - lVar17 != 0);
        }
      }
      local_1e8.val_ = cosf((float)local_278._0_4_);
      Fad<float>::~Fad((Fad<float> *)local_278);
      FadFuncSin<Fad<float>_>::FadFuncSin((FadFuncSin<Fad<float>_> *)local_2a0,&local_50);
      FadExpr<FadFuncSin<Fad<float>_>_>::FadExpr
                ((FadExpr<FadFuncSin<Fad<float>_>_> *)local_280,(FadFuncSin<Fad<float>_> *)local_2a0
                );
      Fad<float>::~Fad((Fad<float> *)local_2a0);
      uVar4 = (uint)local_270._0_4_;
      uVar14 = (ulong)local_270 & 0xffffffff;
      if (local_270._0_4_ == (float)local_230.dx_.num_elts) {
        if (local_270._0_4_ != 0.0) {
LAB_00c84336:
          pfVar10 = local_230.dx_.ptr_to_data;
          if (0 < (int)uVar4) {
            uVar16 = 0;
            do {
              local_198 = (float)(&local_268->_M_color)[uVar16];
              fVar18 = cosf((float)local_278._0_4_);
              *(float *)((long)pfVar10 + uVar16 * 4) = fVar18 * local_198;
              uVar16 = uVar16 + 1;
            } while (uVar14 != uVar16);
          }
        }
      }
      else if (local_270._0_4_ == 0.0) {
        if (local_230.dx_.num_elts != 0) {
          if ((EVP_PKEY_CTX *)local_230.dx_.ptr_to_data != (EVP_PKEY_CTX *)0x0) {
            operator_delete__(local_230.dx_.ptr_to_data);
          }
          local_230.dx_.num_elts = 0;
          local_230.dx_.ptr_to_data = (float *)0x0;
        }
      }
      else {
        if (local_230.dx_.num_elts != 0) {
          if ((EVP_PKEY_CTX *)local_230.dx_.ptr_to_data != (EVP_PKEY_CTX *)0x0) {
            operator_delete__(local_230.dx_.ptr_to_data);
          }
          local_230.dx_.ptr_to_data = (float *)0x0;
        }
        local_230.dx_.num_elts = uVar4;
        uVar16 = uVar14 * 4;
        uVar13 = uVar16;
        if ((int)uVar4 < 0) {
          uVar13 = 0xffffffffffffffff;
        }
        pEVar8 = (EVP_PKEY_CTX *)operator_new__(uVar13);
        local_230.dx_.ptr_to_data = (float *)pEVar8;
        if (local_270._0_4_ != 0.0) goto LAB_00c84336;
        if (0 < (int)uVar4) {
          lVar17 = 0;
          do {
            pp_Var9 = (_Rb_tree_node_base **)((long)&local_268->_M_color + lVar17);
            if (local_270._0_4_ == 0.0) {
              pp_Var9 = &local_260;
            }
            local_198 = *(float *)pp_Var9;
            fVar18 = cosf((float)local_278._0_4_);
            *(float *)(pEVar8 + lVar17) = fVar18 * local_198;
            lVar17 = lVar17 + 4;
          } while (uVar16 - lVar17 != 0);
        }
      }
      local_230.val_ = sinf((float)local_278._0_4_);
      Fad<float>::~Fad((Fad<float> *)local_278);
      uVar14 = local_1c0;
      if (0 < (long)local_1c0) {
        uVar16 = 0;
        do {
          if ((uVar12 != uVar16) && (uVar15 != uVar16)) {
            if (((this->super_TPZBaseMatrix).fRow <= (long)uVar16) ||
               (((long)uVar12 < 0 || ((this->super_TPZBaseMatrix).fCol <= (long)uVar12)))) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar16,uVar12);
            iVar6 = local_1e8.dx_.num_elts;
            local_280._0_4_ = local_1e8.val_;
            local_278._0_4_ = local_1e8.dx_.num_elts;
            local_270 = (_Base_ptr)0x0;
            if ((long)local_1e8.dx_.num_elts != 0) {
              uVar14 = (long)local_1e8.dx_.num_elts * 4;
              if (local_1e8.dx_.num_elts < 0) {
                uVar14 = 0xffffffffffffffff;
              }
              local_270 = (_Base_ptr)operator_new__(uVar14);
              MEM_CPY<float>::copy
                        ((MEM_CPY<float> *)local_270,(EVP_PKEY_CTX *)local_1e8.dx_.ptr_to_data,
                         (EVP_PKEY_CTX *)(ulong)(uint)iVar6);
            }
            local_268 = (_Base_ptr)CONCAT44(local_268._4_4_,local_1e8.defaultVal);
            local_240.fadexpr_.right_ = (Fad<float> *)local_280;
            local_240.fadexpr_.left_ = (Fad<float> *)CONCAT44(extraout_var_04,iVar7);
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar16) || ((long)uVar15 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar16,uVar15);
            iVar6 = local_230.dx_.num_elts;
            local_2a0._0_4_ = local_230.val_;
            local_2a0._8_4_ = local_230.dx_.num_elts;
            local_290 = (MEM_CPY<float> *)0x0;
            if ((long)local_230.dx_.num_elts != 0) {
              uVar14 = (long)local_230.dx_.num_elts * 4;
              if (local_230.dx_.num_elts < 0) {
                uVar14 = 0xffffffffffffffff;
              }
              local_290 = (MEM_CPY<float> *)operator_new__(uVar14);
              MEM_CPY<float>::copy
                        (local_290,(EVP_PKEY_CTX *)local_230.dx_.ptr_to_data,
                         (EVP_PKEY_CTX *)(ulong)(uint)iVar6);
            }
            local_288 = local_230.defaultVal;
            local_210._0_8_ = &local_240;
            local_210._8_8_ = local_250;
            local_250._0_8_ = (Fad<float> *)CONCAT44(extraout_var_05,iVar7);
            local_250._8_8_ = (Fad<float> *)local_2a0;
            Fad<float>::operator=
                      (&local_d0,
                       (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
                        *)local_210);
            Fad<float>::~Fad((Fad<float> *)local_2a0);
            Fad<float>::~Fad((Fad<float> *)local_280);
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar16) || ((long)uVar12 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar12)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar16,uVar12);
            iVar6 = local_230.dx_.num_elts;
            local_280._0_4_ = local_230.val_;
            local_278._0_4_ = local_230.dx_.num_elts;
            local_270 = (_Base_ptr)0x0;
            if ((long)local_230.dx_.num_elts != 0) {
              uVar14 = (long)local_230.dx_.num_elts * 4;
              if (local_230.dx_.num_elts < 0) {
                uVar14 = 0xffffffffffffffff;
              }
              local_270 = (_Base_ptr)operator_new__(uVar14);
              MEM_CPY<float>::copy
                        ((MEM_CPY<float> *)local_270,(EVP_PKEY_CTX *)local_230.dx_.ptr_to_data,
                         (EVP_PKEY_CTX *)(ulong)(uint)iVar6);
            }
            local_268 = (_Base_ptr)CONCAT44(local_268._4_4_,local_230.defaultVal);
            local_240.fadexpr_.right_ = (Fad<float> *)local_280;
            local_240.fadexpr_.left_ = (Fad<float> *)CONCAT44(extraout_var_06,iVar7);
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar16) || ((long)uVar15 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar16,uVar15);
            iVar6 = local_1e8.dx_.num_elts;
            local_2a0._0_4_ = local_1e8.val_;
            local_2a0._8_4_ = local_1e8.dx_.num_elts;
            local_290 = (MEM_CPY<float> *)0x0;
            if ((long)local_1e8.dx_.num_elts != 0) {
              uVar14 = (long)local_1e8.dx_.num_elts * 4;
              if (local_1e8.dx_.num_elts < 0) {
                uVar14 = 0xffffffffffffffff;
              }
              local_290 = (MEM_CPY<float> *)operator_new__(uVar14);
              MEM_CPY<float>::copy
                        (local_290,(EVP_PKEY_CTX *)local_1e8.dx_.ptr_to_data,
                         (EVP_PKEY_CTX *)(ulong)(uint)iVar6);
            }
            local_288 = local_1e8.defaultVal;
            local_210._0_8_ = &local_240;
            local_210._8_8_ = local_250;
            local_250._0_8_ = (Fad<float> *)CONCAT44(extraout_var_07,iVar7);
            local_250._8_8_ = (Fad<float> *)local_2a0;
            Fad<float>::operator=
                      (&local_f0,
                       (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>
                        *)local_210);
            Fad<float>::~Fad((Fad<float> *)local_2a0);
            Fad<float>::~Fad((Fad<float> *)local_280);
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar16) || ((long)uVar12 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar12)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar16,uVar12);
            pfVar10 = (float *)CONCAT44(extraout_var_08,iVar6);
            *pfVar10 = local_d0.val_;
            Vector<float>::operator=((Vector<float> *)(pfVar10 + 2),&local_d0.dx_);
            pfVar10[6] = local_d0.defaultVal;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar12) || ((long)uVar12 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar16)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar12,uVar16);
            pfVar10 = (float *)CONCAT44(extraout_var_09,iVar6);
            *pfVar10 = local_d0.val_;
            Vector<float>::operator=((Vector<float> *)(pfVar10 + 2),&local_d0.dx_);
            pfVar10[6] = local_d0.defaultVal;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar16) || ((long)uVar15 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar16,uVar15);
            pfVar10 = (float *)CONCAT44(extraout_var_10,iVar6);
            *pfVar10 = local_f0.val_;
            Vector<float>::operator=((Vector<float> *)(pfVar10 + 2),&local_f0.dx_);
            pfVar10[6] = local_f0.defaultVal;
            if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar15 < 0)) ||
               ((this->super_TPZBaseMatrix).fCol <= (long)uVar16)) {
              Error("TPZMatrix<TVar>::Operator()","Index out of range");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                         ,0x33d);
            }
            iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                              (this,uVar15,uVar16);
            pfVar10 = (float *)CONCAT44(extraout_var_11,iVar6);
            *pfVar10 = local_f0.val_;
            Vector<float>::operator=((Vector<float> *)(pfVar10 + 2),&local_f0.dx_);
            pfVar10[6] = local_f0.defaultVal;
            uVar14 = local_1c0;
          }
          uVar16 = uVar16 + 1;
        } while (uVar14 != uVar16);
      }
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar12) || ((long)uVar12 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar12)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar12,uVar12);
      local_250._0_8_ = CONCAT44(extraout_var_12,iVar6);
      local_240.fadexpr_.left_ = (Fad<float> *)local_250;
      local_280._0_4_ = 2.0;
      local_278 = (undefined1  [8])((ulong)local_278 & 0xffffffff00000000);
      local_270 = (_Base_ptr)0x0;
      local_268 = (_Base_ptr)((ulong)local_268 & 0xffffffff00000000);
      local_250._8_8_ = &local_1e8;
      local_240.fadexpr_.right_ = &local_1e8;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar12) || ((long)(uVar15 | uVar12) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      local_1b0._0_4_ =
           (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                     (this,uVar12,uVar15);
      local_1b0._4_4_ = extraout_var_13;
      local_1b0._8_8_ = local_1b8;
      local_1a0 = &local_230;
      local_1f8._0_8_ = local_1b0 + 8;
      local_210._0_8_ = &local_240;
      local_210._8_8_ = local_1f8;
      local_1f8._8_8_ = &local_1e8;
      local_1b8 = (undefined1  [8])local_280;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar15 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar15,uVar15);
      local_150.fadexpr_.left_ = (Fad<float> *)CONCAT44(extraout_var_14,iVar6);
      local_150.fadexpr_.right_ = &local_230;
      local_140.fadexpr_.left_ = &local_150;
      local_2a0._0_8_ = local_210;
      local_2a0._8_8_ = &local_140;
      local_140.fadexpr_.right_ = local_150.fadexpr_.right_;
      Fad<float>::operator=
                (&local_70,
                 (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                  *)local_2a0);
      Fad<float>::~Fad((Fad<float> *)local_280);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar12) || ((long)uVar12 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar12)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar12,uVar12);
      local_250._0_8_ = CONCAT44(extraout_var_15,iVar6);
      local_250._8_8_ = &local_230;
      local_240.fadexpr_.left_ = (Fad<float> *)local_250;
      local_280._0_4_ = 2.0;
      local_278 = (undefined1  [8])((ulong)local_278 & 0xffffffff00000000);
      local_270 = (_Base_ptr)0x0;
      local_268 = (_Base_ptr)((ulong)local_268 & 0xffffffff00000000);
      local_240.fadexpr_.right_ = (Fad<float> *)local_250._8_8_;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar12) || ((long)(uVar15 | uVar12) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      local_1b0._0_4_ =
           (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                     (this,uVar12,uVar15);
      local_1b0._4_4_ = extraout_var_16;
      local_1b0._8_8_ = local_1b8;
      local_1a0 = &local_230;
      local_1f8._0_8_ = local_1b0 + 8;
      local_210._0_8_ = &local_240;
      local_210._8_8_ = local_1f8;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar15 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
        local_1f8._8_8_ = &local_1e8;
        local_1b8 = (undefined1  [8])local_280;
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      local_1f8._8_8_ = &local_1e8;
      local_1b8 = (undefined1  [8])local_280;
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar15,uVar15);
      local_150.fadexpr_.left_ = (Fad<float> *)CONCAT44(extraout_var_17,iVar6);
      local_140.fadexpr_.left_ = &local_150;
      local_2a0._0_8_ = local_210;
      local_2a0._8_8_ = &local_140;
      local_150.fadexpr_.right_ = &local_1e8;
      local_140.fadexpr_.right_ = &local_1e8;
      Fad<float>::operator=
                (&local_90,
                 (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>_>_>
                  *)local_2a0);
      Fad<float>::~Fad((Fad<float> *)local_280);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar12) || ((long)uVar12 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar12)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar12,uVar12);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar15 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar15,uVar15);
      local_240.fadexpr_.right_ = (Fad<float> *)CONCAT44(extraout_var_19,iVar7);
      local_210._0_8_ = &local_240;
      local_2a0._0_8_ = local_210;
      local_2a0._8_8_ = &local_230;
      local_240.fadexpr_.left_ = (Fad<float> *)CONCAT44(extraout_var_18,iVar6);
      local_210._8_8_ = &local_1e8;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar12) || ((long)(uVar15 | uVar12) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar12,uVar15);
      local_250._0_8_ = CONCAT44(extraout_var_20,iVar6);
      local_1b8 = (undefined1  [8])&local_230;
      local_1f8._0_8_ = local_1b0 + 8;
      local_1f8._8_8_ = local_1b8;
      local_250._8_8_ = local_1f8;
      local_280 = (undefined1  [8])local_2a0;
      local_278 = (undefined1  [8])local_250;
      local_1b0._0_8_ = local_1b8;
      local_1b0._8_8_ = &local_1e8;
      local_1a0 = &local_1e8;
      Fad<float>::operator=
                (&local_110,
                 (FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>_>_>_>_>_>_>
                  *)local_280);
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar12) || ((long)uVar12 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar12)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar12,uVar12);
      pfVar10 = (float *)CONCAT44(extraout_var_21,iVar6);
      *pfVar10 = local_70.val_;
      Vector<float>::operator=((Vector<float> *)(pfVar10 + 2),&local_70.dx_);
      pfVar10[6] = local_70.defaultVal;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)uVar15 < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar15,uVar15);
      pfVar10 = (float *)CONCAT44(extraout_var_22,iVar6);
      *pfVar10 = local_90.val_;
      Vector<float>::operator=((Vector<float> *)(pfVar10 + 2),&local_90.dx_);
      pfVar10[6] = local_90.defaultVal;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar12) || ((long)(uVar15 | uVar12) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar15)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar12,uVar15);
      pfVar10 = (float *)CONCAT44(extraout_var_23,iVar6);
      *pfVar10 = local_110.val_;
      Vector<float>::operator=((Vector<float> *)(pfVar10 + 2),&local_110.dx_);
      pfVar10[6] = local_110.defaultVal;
      if ((((this->super_TPZBaseMatrix).fRow <= (long)uVar15) || ((long)(uVar15 | uVar12) < 0)) ||
         ((this->super_TPZBaseMatrix).fCol <= (long)uVar12)) {
        Error("TPZMatrix<TVar>::Operator()","Index out of range");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                   ,0x33d);
      }
      iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                        (this,uVar15,uVar12);
      pfVar10 = (float *)CONCAT44(extraout_var_24,iVar6);
      *pfVar10 = local_110.val_;
      Vector<float>::operator=((Vector<float> *)(pfVar10 + 2),&local_110.dx_);
      pfVar10[6] = local_110.defaultVal;
      lVar17 = local_1c8 + 1;
    } while (lVar17 < *local_188);
  }
  if (local_160 != (TPZVec<Fad<float>_> *)0x0) {
    local_268 = (_Base_ptr)local_278;
    local_278 = (undefined1  [8])((ulong)local_278 & 0xffffffff00000000);
    local_270 = (_Base_ptr)0x0;
    local_258 = 0;
    local_260 = local_268;
    local_1c8 = lVar17;
    if (0 < (long)uVar14) {
      uVar14 = 0;
      do {
        if (((this->super_TPZBaseMatrix).fRow <= (long)uVar14) ||
           ((this->super_TPZBaseMatrix).fCol <= (long)uVar14)) {
          Error("TPZMatrix<TVar>::Operator()","Index out of range");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.h"
                     ,0x33d);
        }
        iVar6 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])
                          (this,uVar14,uVar14);
        pfVar10 = (float *)CONCAT44(extraout_var_25,iVar6);
        local_2a0._0_4_ = *pfVar10;
        fVar18 = pfVar10[2];
        local_2a0._8_4_ = fVar18;
        local_290 = (MEM_CPY<float> *)0x0;
        if ((long)(int)fVar18 == 0) {
          local_288 = pfVar10[6];
          local_130.dx_.num_elts = 0;
          local_130.dx_.ptr_to_data = (float *)0x0;
          local_130.val_ = *pfVar10;
        }
        else {
          uVar12 = 0xffffffffffffffff;
          if (-1 < (int)fVar18) {
            uVar12 = (long)(int)fVar18 * 4;
          }
          local_290 = (MEM_CPY<float> *)operator_new__(uVar12);
          MEM_CPY<float>::copy
                    (local_290,*(EVP_PKEY_CTX **)(pfVar10 + 4),(EVP_PKEY_CTX *)(ulong)(uint)fVar18);
          uVar3 = local_2a0._8_8_;
          local_288 = pfVar10[6];
          local_130.val_ = (float)local_2a0._0_4_;
          local_130.dx_.num_elts = local_2a0._8_4_;
          local_130.dx_.ptr_to_data = (float *)0x0;
          if ((long)(int)local_2a0._8_4_ != 0) {
            uVar12 = (long)(int)local_2a0._8_4_ * 4;
            if ((int)local_2a0._8_4_ < 0) {
              uVar12 = 0xffffffffffffffff;
            }
            local_130.dx_.ptr_to_data = (float *)operator_new__(uVar12);
            MEM_CPY<float>::copy
                      ((MEM_CPY<float> *)local_130.dx_.ptr_to_data,(EVP_PKEY_CTX *)local_290,
                       (EVP_PKEY_CTX *)(uVar3 & 0xffffffff));
          }
        }
        local_210._0_8_ = (undefined8)local_130.val_;
        local_130.defaultVal = local_288;
        std::
        _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
        ::_M_insert_equal<double>
                  ((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
                    *)local_280,(double *)local_210);
        Fad<float>::~Fad(&local_130);
        Fad<float>::~Fad((Fad<float> *)local_2a0);
        uVar14 = uVar14 + 1;
      } while (local_1c0 != uVar14);
    }
    pTVar5 = local_160;
    uVar14 = local_1c0;
    (*local_160->_vptr_TPZVec[3])(local_160,local_1c0);
    if (local_268 != (_Rb_tree_node_base *)local_278) {
      lVar17 = uVar14 * 0x20 + -0x18;
      p_Var11 = local_268;
      do {
        pFVar2 = pTVar5->fStore;
        *(float *)((long)pFVar2 + lVar17 + -8) = (float)*(double *)(p_Var11 + 1);
        if (*(int *)((long)&pFVar2->val_ + lVar17) != 0) {
          local_2a0._0_8_ = local_2a0._0_8_ & 0xffffffff00000000;
          Vector<float>::operator=
                    ((Vector<float> *)((long)&pFVar2->val_ + lVar17),(float *)local_2a0);
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        lVar17 = lVar17 + -0x20;
      } while (p_Var11 != (_Rb_tree_node_base *)local_278);
    }
    std::
    _Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>::
    ~_Rb_tree((_Rb_tree<double,_double,_std::_Identity<double>,_std::less<double>,_std::allocator<double>_>
               *)local_280);
    lVar17 = local_1c8;
  }
  fVar18 = ABS(local_b0.val_);
  dVar1 = *local_158;
  *local_158 = (double)fVar18;
  *local_188 = lVar17;
  Fad<float>::~Fad(&local_110);
  Fad<float>::~Fad(&local_90);
  Fad<float>::~Fad(&local_70);
  Fad<float>::~Fad(&local_f0);
  Fad<float>::~Fad(&local_d0);
  Fad<float>::~Fad(&local_230);
  Fad<float>::~Fad(&local_1e8);
  Fad<float>::~Fad(&local_50);
  Fad<float>::~Fad(&local_180);
  Fad<float>::~Fad(&local_b0);
  return (double)fVar18 < dVar1;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigenvaluesJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> * Sort){
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols()){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false){
		PZError << __PRETTY_FUNCTION__ << " - Jacobi method of computing eigenvalues requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	int64_t iter = 0;
	TVar res = (TVar)2. * (TVar)tol;
	const int64_t size = this->Rows();
	int64_t i, j;
	int64_t p = -1, q = -1;
	TVar maxval, theta, cost, sint, aux, aux2, Spp, Sqq, Spq;
	while (iter < numiterations){
		/** First of all find the max value off diagonal */
		maxval = 0.;
		for(i = 0; i < size; i++){
			for(j = 0; j < i; j++) {
				if( fabs(this->operator ( )(i,j) ) > fabs(maxval) ) {
					p = i;
					q = j;
					maxval = fabs( this->operator ( )(i,j) );
				}//if
			}//for j
		}//for i
		
		/** Check if max value off diagonal is lesser than required tolerance */
		res = maxval;
		if ((REAL)(fabs(res)) < tol) break;
		
		/** Compute angle of rotation */
		theta = (TVar)0.5 * atan((TVar)2. * this->operator ( )(p,q) / (this->operator ( )(q,q) - this->operator ( )(p,p) ) );
		cost = cos(theta);
		sint = sin(theta);
		
		/** Apply rotation */
		for(i = 0; i < size; i++){
			if (i != p && i != q){
				
				aux = this->operator ( )(i,p) * (TVar)cost - this->operator ( )(i,q) * (TVar)sint;
				aux2 = this->operator ( )(i,p) * (TVar)sint + this->operator ( )(i,q) * (TVar)cost;
				
				this->operator ( )(i,p) = aux;
				this->operator ( )(p,i) = aux;
				
				this->operator ( )(i,q) = aux2;
				this->operator ( )(q,i) = aux2;
				
			}//if
		}//for i
		
		Spp = this->operator ( )(p,p) * cost * cost -(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * sint * sint;
		Sqq = this->operator ( )(p,p) * sint * sint +(TVar)2. * this->operator ( )(p,q) * sint * cost + this->operator ( )(q,q) * cost * cost;
		Spq = ( this->operator ( )(p,p) - this->operator ( )(q,q) ) * cost * sint + this->operator ( )(p,q)*( cost*cost - sint*sint );
		
		this->operator ( )(p,p) = Spp;
		this->operator ( )(q,q) = Sqq;
		this->operator ( )(p,q) = Spq;
		this->operator ( )(q,p) = Spq;
		
		iter++;
	}//while
	
	/** Sorting */
	if (Sort){
		multiset< REAL > myset;
		for(i = 0; i < size; i++)
        {   TVar exps = this->operator ( )(i,i);
            myset.insert( (TPZExtractVal::val(exps)) );
        }
		
#ifdef PZDEBUG2
		if ((int64_t)myset.size() != size) PZError << __PRETTY_FUNCTION__ << " - ERROR!" << endl;
#endif
		
		Sort->Resize(size);
		multiset< REAL >::iterator w, e = myset.end();
		for(i = size - 1, w = myset.begin(); w != e; w++, i--){
			Sort->operator [ ](i) = *w;
		}//for
	}//if (Sort)
	
	
	if ((REAL)(fabs(res)) < tol){
		tol = fabs(res);
		numiterations = iter;
		return true;
	}
	
	tol = fabs(res);
	numiterations = iter;
	return false;
	
}